

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall Stack<for_emplace>::Node::~Node(Node *this)

{
  Node *this_00;
  Node *this_local;
  
  if (this->next != (Node *)0x0) {
    this_00 = this->next;
    if (this_00 != (Node *)0x0) {
      ~Node(this_00);
      operator_delete(this_00,0x30);
    }
    this->next = (Node *)0x0;
  }
  for_emplace::~for_emplace(&this->data);
  return;
}

Assistant:

~Node() {
			if (next != nullptr) {
				delete next;
				next = nullptr;
			}
		}